

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eckey_impl.h
# Opt level: O3

int secp256k1_eckey_pubkey_serialize(secp256k1_ge *elem,uchar *pub,size_t *size,int compressed)

{
  secp256k1_fe *r;
  long lVar1;
  int iVar2;
  secp256k1_ge **ppsVar3;
  long lVar4;
  secp256k1_ge *extraout_RDX;
  size_t count;
  bool bVar5;
  secp256k1_ge *ptr;
  secp256k1_context *ctx;
  byte *pbVar6;
  bool bVar7;
  size_t sStack_b8;
  secp256k1_ge *psStack_b0;
  secp256k1_ge *psStack_a8;
  byte abStack_a0 [32];
  byte abStack_80 [40];
  uchar *puStack_58;
  secp256k1_fe *psStack_50;
  
  secp256k1_ge_verify(elem);
  iVar2 = 0;
  if (elem->infinity == 0) {
    secp256k1_fe_normalize_var(&elem->x);
    r = &elem->y;
    secp256k1_fe_normalize_var(r);
    ptr = elem;
    secp256k1_fe_get_b32(pub + 1,&elem->x);
    if (compressed == 0) {
      *size = 0x41;
      *pub = '\x04';
      secp256k1_fe_get_b32(pub + 0x21,r);
    }
    else {
      *size = 0x21;
      ctx = (secp256k1_context *)r;
      secp256k1_fe_verify(r);
      if ((elem->y).normalized == 0) {
        secp256k1_eckey_pubkey_serialize_cold_1();
        psStack_50 = r;
        puStack_58 = pub;
        if (ctx == (secp256k1_context *)0x0) {
          secp256k1_ec_pubkey_cmp_cold_1();
          if (ctx == (secp256k1_context *)0x0) {
            secp256k1_ec_pubkey_sort_cold_2();
          }
          else if (ptr != (secp256k1_ge *)0x0) {
            secp256k1_hsort(ptr,count,8,secp256k1_ec_pubkey_sort_cmp,ctx);
            return 1;
          }
          secp256k1_ec_pubkey_sort_cold_1();
          return 0;
        }
        psStack_b0 = ptr;
        psStack_a8 = extraout_RDX;
        ppsVar3 = &psStack_b0;
        pbVar6 = abStack_a0;
        bVar7 = true;
        do {
          bVar5 = bVar7;
          sStack_b8 = 0x21;
          iVar2 = secp256k1_ec_pubkey_serialize
                            (ctx,pbVar6,&sStack_b8,(secp256k1_pubkey *)*ppsVar3,0x102);
          if (iVar2 == 0) {
            pbVar6[0x10] = 0;
            pbVar6[0x11] = 0;
            pbVar6[0x12] = 0;
            pbVar6[0x13] = 0;
            pbVar6[0x14] = 0;
            pbVar6[0x15] = 0;
            pbVar6[0x16] = 0;
            pbVar6[0x17] = 0;
            pbVar6[0x18] = 0;
            pbVar6[0x19] = 0;
            pbVar6[0x1a] = 0;
            pbVar6[0x1b] = 0;
            pbVar6[0x1c] = 0;
            pbVar6[0x1d] = 0;
            pbVar6[0x1e] = 0;
            pbVar6[0x1f] = 0;
            pbVar6[0] = 0;
            pbVar6[1] = 0;
            pbVar6[2] = 0;
            pbVar6[3] = 0;
            pbVar6[4] = 0;
            pbVar6[5] = 0;
            pbVar6[6] = 0;
            pbVar6[7] = 0;
            pbVar6[8] = 0;
            pbVar6[9] = 0;
            pbVar6[10] = 0;
            pbVar6[0xb] = 0;
            pbVar6[0xc] = 0;
            pbVar6[0xd] = 0;
            pbVar6[0xe] = 0;
            pbVar6[0xf] = 0;
            pbVar6[0x20] = 0;
          }
          ppsVar3 = &psStack_a8;
          pbVar6 = abStack_80 + 1;
          bVar7 = false;
        } while (bVar5);
        lVar4 = 0;
        do {
          pbVar6 = abStack_a0 + lVar4;
          lVar1 = lVar4 + 1;
          if (*pbVar6 != abStack_80[lVar1]) break;
          bVar7 = lVar4 != 0x20;
          lVar4 = lVar4 + 1;
        } while (bVar7);
        return (uint)*pbVar6 - (uint)abStack_80[lVar1];
      }
      *pub = (byte)r->n[0] & 1 | 2;
    }
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int secp256k1_eckey_pubkey_serialize(secp256k1_ge *elem, unsigned char *pub, size_t *size, int compressed) {
    if (secp256k1_ge_is_infinity(elem)) {
        return 0;
    }
    secp256k1_fe_normalize_var(&elem->x);
    secp256k1_fe_normalize_var(&elem->y);
    secp256k1_fe_get_b32(&pub[1], &elem->x);
    if (compressed) {
        *size = 33;
        pub[0] = secp256k1_fe_is_odd(&elem->y) ? SECP256K1_TAG_PUBKEY_ODD : SECP256K1_TAG_PUBKEY_EVEN;
    } else {
        *size = 65;
        pub[0] = SECP256K1_TAG_PUBKEY_UNCOMPRESSED;
        secp256k1_fe_get_b32(&pub[33], &elem->y);
    }
    return 1;
}